

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::visitCallExpr(CheckerVisitor *this,CallExpr *expr)

{
  Visitor *in_RSI;
  CallExpr *in_RDI;
  CheckerVisitor *unaff_retaddr;
  CallExpr *in_stack_00000018;
  CheckerVisitor *in_stack_00000020;
  CallExpr *in_stack_00000028;
  CheckerVisitor *in_stack_00000030;
  CallExpr *in_stack_00000048;
  CheckerVisitor *in_stack_00000050;
  CallExpr *in_stack_00000098;
  CheckerVisitor *in_stack_000000a0;
  CallExpr *in_stack_000000f8;
  CheckerVisitor *in_stack_00000100;
  CallExpr *in_stack_00000128;
  CheckerVisitor *in_stack_00000130;
  CallExpr *call;
  
  call = in_RDI;
  checkExtendToAppend(this,expr);
  checkAlreadyRequired(in_stack_00000130,in_stack_00000128);
  checkCallNullable(this,expr);
  checkPersistCall(in_stack_00000050,in_stack_00000048);
  checkForbiddenCall(unaff_retaddr,call);
  checkCallFromRoot(in_stack_00000020,in_stack_00000018);
  checkForbiddenParentDir(in_stack_00000020,in_stack_00000018);
  checkFormatArguments(in_stack_00000030,in_stack_00000028);
  checkContainerModification(unaff_retaddr,call);
  checkUnwantedModification(this,expr);
  checkCannotBeNull(unaff_retaddr,call);
  checkBooleanLambda(in_stack_00000030,in_stack_00000028);
  applyCallToScope(in_stack_000000a0,in_stack_00000098);
  checkAssertCall(this,expr);
  Visitor::visitCallExpr(in_RSI,in_RDI);
  checkArguments(in_stack_00000100,in_stack_000000f8);
  return;
}

Assistant:

void CheckerVisitor::visitCallExpr(CallExpr *expr) {
  checkExtendToAppend(expr);
  checkAlreadyRequired(expr);
  checkCallNullable(expr);
  checkPersistCall(expr);
  checkForbiddenCall(expr);
  checkCallFromRoot(expr);
  checkForbiddenParentDir(expr);
  checkFormatArguments(expr);
  checkContainerModification(expr);
  checkUnwantedModification(expr);
  checkCannotBeNull(expr);
  checkBooleanLambda(expr);

  applyCallToScope(expr);

  checkAssertCall(expr);

  Visitor::visitCallExpr(expr);

  checkArguments(expr);
}